

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

uint * Lpk_CutTruth_rec(Hop_Man_t *pMan,Hop_Obj_t *pObj,int nVars,Vec_Ptr_t *vTtNodes,int *piCount)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  char cVar3;
  Hop_Obj_t *pHVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  uint *__s;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                  ,0x8d,
                  "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  __s = (uint *)(pObj->field_0).pData;
  if (__s == (uint *)0x0) {
    iVar1 = *piCount;
    *piCount = iVar1 + 1;
    if (((long)iVar1 < 0) || (vTtNodes->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    __s = (uint *)vTtNodes->pArray[iVar1];
    uVar5 = *(uint *)&pObj->field_0x20 & 7;
    cVar3 = (char)nVars;
    if (uVar5 == 4) {
      puVar6 = Lpk_CutTruth_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nVars,
                                vTtNodes,piCount);
      puVar7 = Lpk_CutTruth_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nVars,
                                vTtNodes,piCount);
      pHVar4 = pObj->pFanin0;
      pHVar2 = pObj->pFanin1;
      if (((ulong)pHVar2 & 1) == 0 || ((ulong)pHVar4 & 1) == 0) {
        if (((ulong)pHVar4 & 1) == 0 || ((ulong)pHVar2 & 1) != 0) {
          uVar9 = (ulong)(uint)(1 << (cVar3 - 5U & 0x1f));
          if (nVars < 6) {
            uVar9 = 1;
          }
          if (((ulong)pHVar2 & 1) == 0 || ((ulong)pHVar4 & 1) != 0) {
            if (0 < (int)uVar9) {
              lVar8 = uVar9 + 1;
              do {
                __s[lVar8 + -2] = puVar7[lVar8 + -2] & puVar6[lVar8 + -2];
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
            }
          }
          else if (0 < (int)uVar9) {
            lVar8 = uVar9 + 1;
            do {
              __s[lVar8 + -2] = ~puVar7[lVar8 + -2] & puVar6[lVar8 + -2];
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
        }
        else {
          uVar5 = 1 << (cVar3 - 5U & 0x1f);
          if (nVars < 6) {
            uVar5 = 1;
          }
          if (0 < (int)uVar5) {
            lVar8 = (ulong)uVar5 + 1;
            do {
              __s[lVar8 + -2] = ~puVar6[lVar8 + -2] & puVar7[lVar8 + -2];
              lVar8 = lVar8 + -1;
            } while (1 < lVar8);
          }
        }
      }
      else {
        uVar5 = 1 << (cVar3 - 5U & 0x1f);
        if (nVars < 6) {
          uVar5 = 1;
        }
        if (0 < (int)uVar5) {
          lVar8 = (ulong)uVar5 + 1;
          do {
            __s[lVar8 + -2] = ~(puVar7[lVar8 + -2] | puVar6[lVar8 + -2]);
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
      }
    }
    else {
      if (uVar5 != 1) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                      ,0x99,
                      "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                     );
      }
      uVar5 = 1 << (cVar3 - 5U & 0x1f);
      if (nVars < 6) {
        uVar5 = 1;
      }
      if (0 < (int)uVar5) {
        memset(__s,0xff,(ulong)uVar5 << 2);
      }
    }
    (pObj->field_0).pData = __s;
  }
  else if ((short)((ulong)__s >> 0x10) == 0) {
    __assert_fail("((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                  ,0x90,
                  "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  return __s;
}

Assistant:

unsigned * Lpk_CutTruth_rec( Hop_Man_t * pMan, Hop_Obj_t * pObj, int nVars, Vec_Ptr_t * vTtNodes, int * piCount )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    assert( !Hop_IsComplement(pObj) );
    if ( pObj->pData )
    {
        assert( ((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000 );
        return (unsigned *)pObj->pData;
    }
    // get the plan for a new truth table
    pTruth = (unsigned *)Vec_PtrEntry( vTtNodes, (*piCount)++ );
    if ( Hop_ObjIsConst1(pObj) )
        Kit_TruthFill( pTruth, nVars );
    else
    {
        assert( Hop_ObjIsAnd(pObj) );
        // compute the truth tables of the fanins
        pTruth0 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin0(pObj), nVars, vTtNodes, piCount );
        pTruth1 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin1(pObj), nVars, vTtNodes, piCount );
        // creat the truth table of the node
        Kit_TruthAndPhase( pTruth, pTruth0, pTruth1, nVars, Hop_ObjFaninC0(pObj), Hop_ObjFaninC1(pObj) );
    }
    pObj->pData = pTruth;
    return pTruth;
}